

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O2

void psh_globals_set_scale
               (PSH_Globals globals,FT_Fixed x_scale,FT_Fixed y_scale,FT_Fixed x_delta,
               FT_Fixed y_delta)

{
  PSH_BluesRec *pPVar1;
  FT_Pos FVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  FT_UInt FVar7;
  int iVar8;
  uint uVar9;
  PSH_BluesRec *pPVar10;
  PSH_Blue_ZoneRec *pPVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  FT_Pos *pFVar15;
  int iVar16;
  bool bVar17;
  
  if ((globals->dimension[0].scale_mult != x_scale) ||
     (globals->dimension[0].scale_delta != x_delta)) {
    globals->dimension[0].scale_mult = x_scale;
    globals->dimension[0].scale_delta = x_delta;
    psh_globals_scale_widths(globals,0);
  }
  if ((globals->dimension[1].scale_mult == y_scale) &&
     (globals->dimension[1].scale_delta == y_delta)) {
    return;
  }
  globals->dimension[1].scale_mult = y_scale;
  globals->dimension[1].scale_delta = y_delta;
  psh_globals_scale_widths(globals,1);
  if (y_scale < 0x20c49ba) {
    bVar17 = y_scale * 0x7d < (globals->blues).blue_scale * 8;
  }
  else {
    bVar17 = y_scale < ((globals->blues).blue_scale << 3) / 0x7d;
  }
  pPVar1 = &globals->blues;
  (globals->blues).no_overshoots = bVar17;
  uVar9 = (globals->blues).blue_shift;
  lVar3 = (long)(int)y_scale;
  uVar4 = (int)uVar9 >> 0x1f & uVar9;
  while ((uVar5 = uVar4, 0 < (int)uVar9 &&
         (uVar5 = uVar9,
         0x20 < (int)((ulong)uVar9 * lVar3 + ((long)((ulong)uVar9 * lVar3) >> 0x3f) + 0x8000 >> 0x10
                     )))) {
    uVar9 = uVar9 - 1;
  }
  (globals->blues).blue_threshold = uVar5;
  iVar12 = 0;
  do {
    pPVar10 = pPVar1;
    switch(iVar12) {
    case 0:
      break;
    case 1:
      pPVar10 = (PSH_BluesRec *)&(globals->blues).normal_bottom;
      break;
    case 2:
      pPVar10 = (PSH_BluesRec *)&(globals->blues).family_top;
      break;
    default:
      pPVar10 = (PSH_BluesRec *)&(globals->blues).family_bottom;
      break;
    case 4:
      iVar12 = 0;
      do {
        if (iVar12 == 2) {
          return;
        }
        pPVar10 = (PSH_BluesRec *)&(globals->blues).normal_bottom;
        if (iVar12 == 0) {
          pPVar10 = pPVar1;
        }
        lVar13 = 0x918;
        if (iVar12 == 0) {
          lVar13 = 0x610;
        }
        FVar7 = (pPVar10->normal_top).count;
        pPVar11 = (pPVar10->normal_top).zones;
        while (bVar17 = FVar7 != 0, FVar7 = FVar7 - 1, bVar17) {
          iVar8 = *(int *)((long)(pPVar1->normal_top).zones + lVar13 + -8);
          pFVar15 = (FT_Pos *)((long)&(globals->blues).normal_top.zones[0].cur_bottom + lVar13);
          while (bVar17 = iVar8 != 0, iVar8 = iVar8 + -1, bVar17) {
            iVar6 = pPVar11->org_ref - (int)pFVar15[-4];
            iVar16 = -iVar6;
            if (0 < iVar6) {
              iVar16 = iVar6;
            }
            if ((int)((ulong)(iVar16 * lVar3 + (iVar16 * lVar3 >> 0x3f) + 0x8000) >> 0x10) < 0x40) {
              FVar2 = pFVar15[1];
              pPVar11->cur_bottom = *pFVar15;
              pPVar11->cur_top = FVar2;
              FVar2 = pFVar15[-1];
              pPVar11->cur_ref = pFVar15[-2];
              pPVar11->cur_delta = FVar2;
              break;
            }
            pFVar15 = pFVar15 + 6;
          }
          pPVar11 = pPVar11 + 1;
        }
        iVar12 = iVar12 + 1;
      } while( true );
    }
    FVar7 = (pPVar10->normal_top).count;
    pPVar11 = (pPVar10->normal_top).zones;
    while (bVar17 = FVar7 != 0, FVar7 = FVar7 - 1, bVar17) {
      lVar13 = pPVar11->org_top * lVar3;
      pPVar11->cur_top = (int)((ulong)(lVar13 + 0x8000 + (lVar13 >> 0x3f)) >> 0x10) + y_delta;
      lVar13 = pPVar11->org_bottom * lVar3;
      pPVar11->cur_bottom = (int)((ulong)(lVar13 + 0x8000 + (lVar13 >> 0x3f)) >> 0x10) + y_delta;
      lVar13 = pPVar11->org_ref * lVar3;
      lVar14 = pPVar11->org_delta * lVar3;
      pPVar11->cur_delta = (long)(int)((ulong)(lVar14 + 0x8000 + (lVar14 >> 0x3f)) >> 0x10);
      pPVar11->cur_ref =
           (long)(int)((ulong)(lVar13 + 0x8000 + (lVar13 >> 0x3f)) >> 0x10) + y_delta + 0x20 &
           0xffffffffffffffc0;
      pPVar11 = pPVar11 + 1;
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

FT_LOCAL_DEF( void )
  psh_globals_set_scale( PSH_Globals  globals,
                         FT_Fixed     x_scale,
                         FT_Fixed     y_scale,
                         FT_Fixed     x_delta,
                         FT_Fixed     y_delta )
  {
    PSH_Dimension  dim;


    dim = &globals->dimension[0];
    if ( x_scale != dim->scale_mult  ||
         x_delta != dim->scale_delta )
    {
      dim->scale_mult  = x_scale;
      dim->scale_delta = x_delta;

      psh_globals_scale_widths( globals, 0 );
    }

    dim = &globals->dimension[1];
    if ( y_scale != dim->scale_mult  ||
         y_delta != dim->scale_delta )
    {
      dim->scale_mult  = y_scale;
      dim->scale_delta = y_delta;

      psh_globals_scale_widths( globals, 1 );
      psh_blues_scale_zones( &globals->blues, y_scale, y_delta );
    }
  }